

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_closeCStream(HUF_CStream_t *bitC)

{
  ulong uVar1;
  HUF_CElt elt;
  size_t sVar2;
  ulong uVar3;
  size_t nbBits_1;
  HUF_CStream_t *bitC_local;
  size_t bitContainer;
  size_t nbBytes;
  size_t nbBits;
  
  elt = HUF_endMark();
  sVar2 = HUF_getNbBits(elt);
  if (0xc < sVar2) {
    __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x34f,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
  }
  sVar2 = HUF_getNbBits(elt);
  bitC->bitContainer[0] = bitC->bitContainer[0] >> ((byte)sVar2 & 0x3f);
  sVar2 = HUF_getValue(elt);
  bitC->bitContainer[0] = sVar2 | bitC->bitContainer[0];
  sVar2 = HUF_getNbBitsFast(elt);
  bitC->bitPos[0] = sVar2 + bitC->bitPos[0];
  if (0x40 < (bitC->bitPos[0] & 0xff)) {
    __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x35b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
  }
  uVar1 = bitC->bitPos[0];
  uVar3 = uVar1 & 0xff;
  bitC->bitPos[0] = bitC->bitPos[0] & 7;
  if (uVar3 == 0) {
    __assert_fail("nbBits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x391,"void HUF_flushBits(HUF_CStream_t *, int)");
  }
  if (uVar3 < 0x41) {
    if (bitC->ptr <= bitC->endPtr) {
      MEM_writeLEST(bitC->ptr,bitC->bitContainer[0] >> (0x40U - (char)uVar1 & 0x3f));
      bitC->ptr = bitC->ptr + (uVar3 >> 3);
      if (bitC->endPtr < bitC->ptr) {
        bitC->ptr = bitC->endPtr;
      }
      if (bitC->ptr < bitC->endPtr) {
        bitC_local = (HUF_CStream_t *)
                     (bitC->ptr +
                     ((long)(int)(uint)((bitC->bitPos[0] & 0xff) != 0) - (long)bitC->startPtr));
      }
      else {
        bitC_local = (HUF_CStream_t *)0x0;
      }
      return (size_t)bitC_local;
    }
    __assert_fail("bitC->ptr <= bitC->endPtr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x393,"void HUF_flushBits(HUF_CStream_t *, int)");
  }
  __assert_fail("nbBits <= sizeof(bitC->bitContainer[0]) * 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                ,0x392,"void HUF_flushBits(HUF_CStream_t *, int)");
}

Assistant:

static size_t HUF_closeCStream(HUF_CStream_t* bitC)
{
    HUF_addBits(bitC, HUF_endMark(), /* idx */ 0, /* kFast */ 0);
    HUF_flushBits(bitC, /* kFast */ 0);
    {
        size_t const nbBits = bitC->bitPos[0] & 0xFF;
        if (bitC->ptr >= bitC->endPtr) return 0; /* overflow detected */
        return (size_t)(bitC->ptr - bitC->startPtr) + (nbBits > 0);
    }
}